

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O2

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_int>::resize
          (ImageTemplate<unsigned_int> *this,uint32_t width_,uint32_t height_)

{
  byte bVar1;
  uint *puVar2;
  uint uVar3;
  
  if ((height_ != 0 && width_ != 0) && ((this->_width != width_ || (this->_height != height_)))) {
    clear(this);
    this->_width = width_;
    this->_height = height_;
    uVar3 = this->_colorCount * width_;
    this->_rowSize = uVar3;
    bVar1 = this->_alignment;
    if (uVar3 % (uint)bVar1 != 0) {
      uVar3 = (uVar3 / bVar1 + 1) * (uint)bVar1;
      this->_rowSize = uVar3;
    }
    puVar2 = _allocate(this,(ulong)(uVar3 * height_));
    this->_data = puVar2;
  }
  return;
}

Assistant:

void resize( uint32_t width_, uint32_t height_ )
        {
            if( width_ > 0 && height_ > 0 && (width_ != _width || height_ != _height) ) {
                clear();

                _width  = width_;
                _height = height_;

                _rowSize = width() * colorCount();
                if( _rowSize % alignment() != 0 )
                    _rowSize = (_rowSize / alignment() + 1) * alignment();

                _data = _allocate( _height * _rowSize );
            }
        }